

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(CompilerMSL *this,string *ep_args)

{
  StorageClass SVar1;
  int iVar2;
  size_t sVar3;
  Variant *pVVar4;
  pointer pcVar5;
  undefined8 uVar6;
  SPIRVariable *pSVar7;
  string *psVar8;
  undefined4 uVar9;
  CompilerMSL *pCVar10;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pSVar11;
  char cVar12;
  bool bVar13;
  char cVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  SPIRVariable *pSVar17;
  size_type sVar18;
  MSLConstexprSampler *pMVar19;
  mapped_type *pmVar20;
  mapped_type *pmVar21;
  SPIRVariable *pSVar22;
  long *plVar23;
  SPIRType *pSVar24;
  undefined8 *puVar25;
  Bitset *pBVar26;
  char *__lhs;
  runtime_error *prVar27;
  uint uVar28;
  long lVar29;
  size_type *psVar30;
  ulong *puVar31;
  ulong uVar32;
  uint uVar33;
  SPIRVariable *unaff_RBX;
  ID *__k;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pSVar34;
  MSLConstexprSampler *pMVar35;
  undefined8 uVar36;
  ulong uVar37;
  _Alloc_hider _Var38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  uint uVar39;
  SPIRType *pSVar40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar41;
  SPIRType *unaff_R15;
  long lVar42;
  Resource *pRVar43;
  byte bVar44;
  string __str;
  uint32_t var_id;
  string primary_name;
  char *cv_flags;
  __hashtable *__h;
  string __str_1;
  SmallVector<Resource,_8UL> resources;
  string local_410;
  string *local_3f0;
  string local_3e8;
  CompilerMSL *local_3c8;
  ID local_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [32];
  BaseType local_388;
  uint32_t local_384;
  undefined8 local_380;
  string local_378;
  SPIRType *local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  SPIRVariable *local_330;
  string local_328;
  SmallVector<spirv_cross::SPIRVariable_*,_8UL> *local_308;
  SPIRType *local_300;
  SPIRVariable *local_2f8;
  SPIRType *local_2f0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2e8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2e0;
  ulong *local_2d8;
  uint local_2d0;
  undefined4 uStack_2cc;
  ulong local_2c8 [2];
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  ulong *local_298;
  long local_290;
  ulong local_288 [2];
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_278;
  ParsedIR *local_270;
  string local_268;
  undefined1 local_248 [536];
  
  bVar44 = 0;
  local_248._0_8_ = local_248 + 0x18;
  local_248._8_8_ = 0;
  local_248._16_8_ = 8;
  (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = 0;
  local_270 = &(this->super_CompilerGLSL).super_Compiler.ir;
  local_3f0 = ep_args;
  ParsedIR::create_loop_hard_lock(local_270);
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_3c8 = this;
  if (sVar3 != 0) {
    local_308 = &this->entry_point_bindings;
    unaff_R15 = (SPIRType *)
                (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_2f0 = (SPIRType *)((long)(&(unaff_R15->array).stack_storage + -2) + 8 + sVar3 * 4);
    local_2f8 = (SPIRVariable *)&(this->super_CompilerGLSL).super_Compiler.interlocked_resources;
    local_2e8 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&this->constexpr_samplers_by_id;
    local_2e0 = &(this->atomic_image_vars_emulated)._M_h;
    local_278 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
    do {
      uVar39 = *(uint *)&(unaff_R15->super_IVariant)._vptr_IVariant;
      unaff_RBX = (SPIRVariable *)(ulong)uVar39;
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[(long)unaff_RBX].type == TypeVariable) {
        pSVar17 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + (long)unaff_RBX);
        local_3e8._M_dataplus._M_p._0_4_ = uVar39;
        if (((pSVar17->storage < (StorageBuffer|Input)) &&
            ((0x1205U >> (pSVar17->storage & 0x1f) & 1) != 0)) &&
           (bVar13 = Compiler::is_hidden_variable((Compiler *)this,pSVar17,false), !bVar13)) {
          local_358 = Compiler::get_variable_data_type((Compiler *)this,pSVar17);
          uVar15 = Compiler::get_decoration
                             ((Compiler *)this,local_3e8._M_dataplus._M_p._0_4_,
                              DecorationDescriptorSet);
          bVar13 = is_supported_argument_buffer_type(this,local_358);
          uVar36 = local_248._0_8_;
          SVar1 = pSVar17->storage;
          if (((SVar1 == PushConstant || !bVar13) || (7 < uVar15)) ||
             (((this->msl_options).argument_buffers == false ||
              ((this->argument_buffer_discrete_mask >> (uVar15 & 0x1f) & 1) != 0)))) {
            local_300 = unaff_R15;
            if (((SVar1 == StorageBuffer) || (SVar1 == StorageClassUniform)) &&
               (local_248._8_8_ != 0)) {
              lVar42 = local_248._8_8_ * 0x40;
              local_330 = (SPIRVariable *)0x0;
              lVar29 = 0;
              do {
                uVar15 = Compiler::get_decoration
                                   ((Compiler *)this,
                                    (ID)*(uint32_t *)
                                         (*(long *)((long)(SPIRVariable **)uVar36 + lVar29) + 8),
                                    DecorationDescriptorSet);
                uVar16 = Compiler::get_decoration
                                   ((Compiler *)this,local_3e8._M_dataplus._M_p._0_4_,
                                    DecorationDescriptorSet);
                pCVar10 = local_3c8;
                if (uVar15 == uVar16) {
                  uVar15 = Compiler::get_decoration
                                     ((Compiler *)local_3c8,
                                      (ID)*(uint32_t *)
                                           (*(long *)((long)(SPIRVariable **)uVar36 + lVar29) + 8),
                                      Binding);
                  uVar16 = Compiler::get_decoration
                                     ((Compiler *)pCVar10,local_3e8._M_dataplus._M_p._0_4_,Binding);
                  if (uVar15 != uVar16) goto LAB_0025878c;
                  bVar13 = false;
                  pSVar22 = local_330;
                  if ((*(int *)((long)(uVar36 + 0x30) + lVar29) == 0xf) &&
                     (*(int *)&((__node_base *)&local_358->basetype)->_M_nxt == 0xf)) {
                    pSVar22 = *(SPIRVariable **)((long)(SPIRVariable **)uVar36 + lVar29);
                    iVar2 = *(int *)&(((string *)&pSVar22->storage)->_M_dataplus)._M_p;
                    if ((iVar2 != 0xc) && (iVar2 != 2)) goto LAB_0025878c;
                    *(SPIRVariable **)((long)(uVar36 + 8) + lVar29) = pSVar22;
                    sVar18 = ::std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                      *)local_2f8,(key_type *)&local_3e8);
                    bVar13 = true;
                    if (sVar18 != 0) {
                      local_378._M_dataplus._M_p._0_4_ =
                           *(undefined4 *)(*(long *)((long)(SPIRVariable **)uVar36 + lVar29) + 8);
                      local_3b8._0_8_ = local_2f8;
                      ::std::
                      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      ::
                      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                  *)local_2f8,local_3a8 + 0x30,local_3b8);
                    }
                  }
                }
                else {
LAB_0025878c:
                  bVar13 = false;
                  pSVar22 = local_330;
                }
                local_330 = pSVar22;
                this = local_3c8;
              } while ((!bVar13) &&
                      (bVar13 = lVar42 + -0x40 != lVar29, lVar29 = lVar29 + 0x40, bVar13));
            }
            else {
              local_330 = (SPIRVariable *)0x0;
            }
            if (*(int *)&((__node_base *)&local_358->basetype)->_M_nxt - 0x11U < 2) {
              pMVar19 = find_constexpr_sampler(this,local_3e8._M_dataplus._M_p._0_4_);
              unaff_R15 = local_300;
              unaff_RBX = local_330;
              if (pMVar19 == (MSLConstexprSampler *)0x0) {
                pMVar19 = (MSLConstexprSampler *)0x0;
              }
              else {
                pmVar20 = ::std::
                          map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                          ::operator[]((map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                                        *)local_2e8,(key_type *)&local_3e8);
                pMVar35 = pMVar19;
                for (lVar29 = 0x19; lVar29 != 0; lVar29 = lVar29 + -1) {
                  pmVar20->coord = pMVar35->coord;
                  pMVar35 = (MSLConstexprSampler *)((long)pMVar35 + (ulong)bVar44 * -8 + 4);
                  pmVar20 = (mapped_type *)((long)pmVar20 + (ulong)bVar44 * -8 + 4);
                }
              }
            }
            else {
              pMVar19 = (MSLConstexprSampler *)0x0;
              unaff_RBX = local_330;
              unaff_R15 = local_300;
            }
            local_3b8._0_4_ = (pSVar17->super_IVariant).self.id;
            sVar18 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(local_2e0,(key_type *)local_3b8);
            if (sVar18 == 0) {
              uVar15 = 0;
            }
            else {
              uVar15 = get_metal_resource_index(this,pSVar17,AtomicCounter,0);
            }
            if (*(int *)&((__node_base *)&local_358->basetype)->_M_nxt == 0x11) {
              CompilerGLSL::add_resource_name
                        (&this->super_CompilerGLSL,local_3e8._M_dataplus._M_p._0_4_);
              unaff_RBX = (SPIRVariable *)0x1;
              if ((pMVar19 != (MSLConstexprSampler *)0x0) &&
                 (pMVar19->ycbcr_conversion_enable == true)) {
                unaff_RBX = (SPIRVariable *)(ulong)pMVar19->planes;
              }
              SmallVector<spirv_cross::SPIRVariable_*,_8UL>::reserve
                        (local_308,
                         (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                         buffer_size + 1);
              sVar3 = (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                      buffer_size;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar3]
                   = pSVar17;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size
                   = sVar3 + 1;
              if ((uint32_t)unaff_RBX != 0) {
                uVar16 = 0;
                do {
                  local_3b8._8_8_ = local_330;
                  local_3b8._0_8_ = pSVar17;
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (local_3a8,this,(ulong)local_3e8._M_dataplus._M_p & 0xffffffff,1);
                  local_388 = Image;
                  local_384 = get_metal_resource_index(this,pSVar17,Image,uVar16);
                  local_380 = CONCAT44(uVar15,uVar16);
                  SmallVector<Resource,_8UL>::push_back
                            ((SmallVector<Resource,_8UL> *)local_248,(Resource *)local_3b8);
                  if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
                    operator_delete((void *)local_3a8._0_8_);
                  }
                  uVar16 = uVar16 + 1;
                } while ((uint32_t)unaff_RBX != uVar16);
              }
              unaff_R15 = local_300;
              if ((pMVar19 == (MSLConstexprSampler *)0x0) && ((local_358->image).dim != Buffer)) {
                local_3b8._8_8_ = local_330;
                local_3b8._0_8_ = pSVar17;
                to_sampler_expression_abi_cxx11_
                          ((string *)local_3a8,this,local_3e8._M_dataplus._M_p._0_4_);
                local_388 = Sampler;
                local_384 = get_metal_resource_index(this,pSVar17,Sampler,0);
                local_380 = 0;
LAB_00258a9e:
                SmallVector<Resource,_8UL>::push_back
                          ((SmallVector<Resource,_8UL> *)local_248,(Resource *)local_3b8);
                if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
                  operator_delete((void *)local_3a8._0_8_);
                }
              }
            }
            else if (pMVar19 == (MSLConstexprSampler *)0x0) {
              CompilerGLSL::add_resource_name
                        (&this->super_CompilerGLSL,local_3e8._M_dataplus._M_p._0_4_);
              uVar16 = 0xffffffff;
              if (unaff_RBX == (SPIRVariable *)0x0) {
                uVar16 = get_metal_resource_index
                                   (this,pSVar17,
                                    *(BaseType *)&((__node_base *)&local_358->basetype)->_M_nxt,0);
              }
              SmallVector<spirv_cross::SPIRVariable_*,_8UL>::reserve
                        (local_308,
                         (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                         buffer_size + 1);
              sVar3 = (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                      buffer_size;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar3]
                   = pSVar17;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size
                   = sVar3 + 1;
              local_3b8._0_8_ = pSVar17;
              local_3b8._8_8_ = unaff_RBX;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (local_3a8,this,(ulong)local_3e8._M_dataplus._M_p & 0xffffffff,1);
              local_388 = *(BaseType *)&((__node_base *)&local_358->basetype)->_M_nxt;
              local_380 = (ulong)uVar15 << 0x20;
              local_384 = uVar16;
              goto LAB_00258a9e;
            }
          }
          else {
            bVar13 = is_var_runtime_size_array(this,pSVar17);
            if (bVar13) {
              SmallVector<spirv_cross::SPIRVariable_*,_8UL>::reserve
                        (local_308,
                         (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                         buffer_size + 1);
              sVar3 = (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                      buffer_size;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar3]
                   = pSVar17;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size
                   = sVar3 + 1;
              local_3b8._0_4_ = local_3e8._M_dataplus._M_p._0_4_;
              pmVar21 = ::std::__detail::
                        _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](local_278,(key_type *)local_3b8);
              (pmVar21->decoration).qualified_alias_explicit_override = true;
            }
          }
        }
      }
      unaff_R15 = (SPIRType *)((long)&(unaff_R15->super_IVariant)._vptr_IVariant + 4);
    } while (unaff_R15 != local_2f0);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_410);
  uVar36 = local_248._0_8_;
  if (local_248._8_8_ != 0) {
    pRVar43 = (Resource *)(local_248._0_8_ + local_248._8_8_ * 0x40);
    pSVar40 = (SPIRType *)((local_248._8_8_ - ((long)(local_248._8_8_ + 1) >> 0x3f)) + 1 >> 1);
    if (0x1fffffffffffffe < (long)pSVar40) {
      pSVar40 = (SPIRType *)0x1ffffffffffffff;
    }
    do {
      if ((long)pSVar40 < 1) {
        pSVar17 = (SPIRVariable *)0x0;
        pSVar24 = (SPIRType *)0x0;
        break;
      }
      pSVar22 = (SPIRVariable *)operator_new((long)pSVar40 << 6,(nothrow_t *)&::std::nothrow);
      pSVar17 = pSVar22;
      pSVar24 = pSVar40;
      if (pSVar22 == (SPIRVariable *)0x0) {
        pSVar17 = unaff_RBX;
        pSVar24 = unaff_R15;
        if (pSVar40 == (SPIRType *)0x1) {
          pSVar40 = (SPIRType *)0x0;
        }
        else {
          pSVar40 = (SPIRType *)((ulong)((long)&(pSVar40->super_IVariant)._vptr_IVariant + 1) >> 1);
        }
      }
      unaff_RBX = pSVar17;
      unaff_R15 = pSVar24;
    } while (pSVar22 == (SPIRVariable *)0x0);
    if (pSVar17 == (SPIRVariable *)0x0) {
      pSVar17 = (SPIRVariable *)0x0;
      pSVar24 = (SPIRType *)0x0;
    }
    else if (pSVar24 != (SPIRType *)0x0) {
      pSVar22 = *(SPIRVariable **)(uVar36 + 8);
      (pSVar17->super_IVariant)._vptr_IVariant = (_func_int **)*(SPIRVariable **)uVar36;
      *(SPIRVariable **)&(pSVar17->super_IVariant).self = pSVar22;
      (((string *)&pSVar17->storage)->_M_dataplus)._M_p = (pointer)&pSVar17->dereference_chain;
      pcVar5 = (((string *)(uVar36 + 0x10))->_M_dataplus)._M_p;
      paVar41 = &((string *)(uVar36 + 0x10))->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 == paVar41) {
        uVar6 = *(undefined8 *)((long)&((string *)(uVar36 + 0x10))->field_2 + 8);
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&pSVar17->dereference_chain)->_M_allocated_capacity = paVar41->_M_allocated_capacity;
        *(undefined8 *)((long)&pSVar17->dereference_chain + 8) = uVar6;
      }
      else {
        (((string *)&pSVar17->storage)->_M_dataplus)._M_p = pcVar5;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&pSVar17->dereference_chain)->_M_allocated_capacity = paVar41->_M_allocated_capacity;
      }
      uVar9 = *(undefined4 *)((long)&((string *)(uVar36 + 0x10))->_M_string_length + 4);
      pSVar17->initializer = (ID)*(undefined4 *)&((string *)(uVar36 + 0x10))->_M_string_length;
      pSVar17->basevariable = (VariableID)uVar9;
      (((string *)(uVar36 + 0x10))->_M_dataplus)._M_p = (pointer)paVar41;
      ((string *)(uVar36 + 0x10))->_M_string_length = 0;
      (((string *)(uVar36 + 0x10))->field_2)._M_local_buf[0] = '\0';
      uVar6 = *(undefined8 *)(uVar36 + 0x38);
      *(undefined8 *)
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&pSVar17->dereference_chain)->_M_local_buf + 0x10) = *(undefined8 *)(uVar36 + 0x30);
      *(undefined8 *)
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&pSVar17->dereference_chain)->_M_local_buf + 0x18) = uVar6;
      pSVar22 = pSVar17;
      if (pSVar24 != (SPIRType *)0x1) {
        lVar29 = (long)pSVar24 * 0x40 + -0x40;
        pSVar11 = &pSVar17->dependees;
        do {
          pSVar34 = pSVar11;
          *(undefined8 *)((long)(pSVar34 + -1) + 0x18) =
               *(undefined8 *)((long)(pSVar34 + -2) + 0x10);
          *(undefined8 *)((long)(pSVar34 + -1) + 0x20) =
               *(undefined8 *)((long)(pSVar34 + -2) + 0x18);
          *(SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> **)
           ((long)(pSVar34 + -1) + 0x28) = pSVar34;
          lVar42 = (long)(pSVar34 + -2) + 0x30;
          if (lVar42 == *(long *)((long)(pSVar34 + -2) + 0x20)) {
            sVar3 = *(size_t *)(pSVar34 + -1);
            (pSVar34->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr =
                 *(TypedID<(spirv_cross::Types)0> **)lVar42;
            (pSVar34->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).buffer_size =
                 sVar3;
          }
          else {
            *(long *)((long)(pSVar34 + -1) + 0x28) = *(long *)((long)(pSVar34 + -2) + 0x20);
            (pSVar34->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr =
                 *(TypedID<(spirv_cross::Types)0> **)((long)(pSVar34 + -2) + 0x30);
          }
          *(undefined8 *)((long)(pSVar34 + -1) + 0x30) =
               *(undefined8 *)((long)(pSVar34 + -2) + 0x28);
          *(long *)((long)(pSVar34 + -2) + 0x20) = lVar42;
          *(undefined8 *)((long)(pSVar34 + -2) + 0x28) = 0;
          *(undefined1 *)((long)(pSVar34 + -2) + 0x30) = 0;
          pSVar34->buffer_capacity = *(size_t *)((long)(pSVar34 + -1) + 8);
          *(undefined8 *)(pSVar34->stack_storage).aligned_char =
               *(undefined8 *)((long)(pSVar34 + -1) + 0x10);
          lVar29 = lVar29 + -0x40;
          pSVar11 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
                    ((long)(pSVar34 + 1) + 8);
        } while (lVar29 != 0);
        pSVar22 = (SPIRVariable *)((long)(pSVar34 + -1) + 0x18);
      }
      pSVar7 = *(SPIRVariable **)&(pSVar22->super_IVariant).self;
      *(SPIRVariable **)uVar36 = (SPIRVariable *)(pSVar22->super_IVariant)._vptr_IVariant;
      *(SPIRVariable **)(uVar36 + 8) = pSVar7;
      ::std::__cxx11::string::operator=((string *)(uVar36 + 0x10),(string *)&pSVar22->storage);
      uVar6 = *(undefined8 *)
               (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pSVar22->dereference_chain)->_M_local_buf + 0x18);
      *(undefined8 *)(uVar36 + 0x30) =
           *(undefined8 *)
            (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&pSVar22->dereference_chain)->_M_local_buf + 0x10);
      *(undefined8 *)(uVar36 + 0x38) = uVar6;
    }
    if (pSVar17 == (SPIRVariable *)0x0) {
      ::std::
      __inplace_stable_sort<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>>
                (uVar36,&pRVar43->var);
    }
    else {
      ::std::
      __stable_sort_adaptive<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>>
                (uVar36,&pRVar43->var,pSVar17,pSVar24);
    }
    if (pSVar24 != (SPIRType *)0x0) {
      lVar29 = (long)pSVar24 << 6;
      paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&pSVar17->dereference_chain;
      do {
        pcVar5 = (((string *)(paVar41 + -1))->_M_dataplus)._M_p;
        if (paVar41 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5) {
          operator_delete(pcVar5);
        }
        paVar41 = paVar41 + 4;
        lVar29 = lVar29 + -0x40;
      } while (lVar29 != 0);
    }
    operator_delete(pSVar17);
  }
  if (local_248._8_8_ != 0) {
    local_330 = (SPIRVariable *)(local_248._0_8_ + local_248._8_8_ * 0x40);
    local_2e0 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_3c8->plane_name_suffix;
    local_358 = (SPIRType *)&(local_3c8->super_CompilerGLSL).super_Compiler.interlocked_resources;
    local_2f8 = (SPIRVariable *)&local_3c8->atomic_image_vars_emulated;
    local_300 = (SPIRType *)&(local_3c8->super_CompilerGLSL).super_Compiler.ir.meta;
    local_308 = (SmallVector<spirv_cross::SPIRVariable_*,_8UL> *)&local_3c8->buffer_aliases_discrete
    ;
    local_2e8 = &(local_3c8->recursive_inputs)._M_h;
    pRVar43 = (Resource *)local_248._0_8_;
    do {
      pSVar17 = pRVar43->var;
      pSVar40 = Compiler::get_variable_data_type((Compiler *)local_3c8,pSVar17);
      local_3bc.id = (pSVar17->super_IVariant).self.id;
      switch(pRVar43->basetype) {
      case Struct:
        __k = &(pSVar40->super_IVariant).self;
        pmVar21 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_300,__k);
        pCVar10 = local_3c8;
        if ((pmVar21->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size != 0) {
          if (pRVar43->discrete_descriptor_alias == (SPIRVariable *)0x0) {
            sVar3 = (pSVar40->array).super_VectorView<unsigned_int>.buffer_size;
            if (sVar3 == 0) {
              if (local_3f0->_M_string_length != 0) {
                ::std::__cxx11::string::append((char *)local_3f0);
              }
              get_argument_address_space_abi_cxx11_(&local_410,local_3c8,pSVar17);
              plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
              local_3b8._0_8_ = local_3a8;
              pSVar17 = (SPIRVariable *)(plVar23 + 2);
              if ((SPIRVariable *)*plVar23 == pSVar17) {
                local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                local_3a8._8_8_ = plVar23[3];
              }
              else {
                local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                local_3b8._0_8_ = (SPIRVariable *)*plVar23;
              }
              paVar41 = &local_410.field_2;
              local_3b8._8_8_ = plVar23[1];
              *plVar23 = (long)pSVar17;
              plVar23[1] = 0;
              *(undefined1 *)(plVar23 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
              if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                operator_delete((void *)local_3b8._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_410._M_dataplus._M_p != paVar41) {
                operator_delete(local_410._M_dataplus._M_p);
              }
              local_3b8._0_4_ = __k->id;
              sVar18 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count(local_2e8,(key_type *)local_3b8);
              if (sVar18 == 0) {
                (*(local_3c8->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (local_3a8 + 0x30,local_3c8,pSVar40,0);
                puVar25 = (undefined8 *)::std::__cxx11::string::append(local_3a8 + 0x30);
                local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                puVar31 = puVar25 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar25 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar31) {
                  local_3e8.field_2._M_allocated_capacity = *puVar31;
                  local_3e8.field_2._8_8_ = puVar25[3];
                }
                else {
                  local_3e8.field_2._M_allocated_capacity = *puVar31;
                  local_3e8._M_dataplus._M_p = (pointer)*puVar25;
                }
                local_3e8._M_string_length = puVar25[1];
                *puVar25 = puVar31;
                puVar25[1] = 0;
                *(undefined1 *)(puVar25 + 2) = 0;
                to_restrict(local_3c8,local_3bc.id,true);
                puVar25 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3e8);
                psVar30 = puVar25 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar25 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar30) {
                  local_410.field_2._M_allocated_capacity = *psVar30;
                  local_410.field_2._8_8_ = puVar25[3];
                  local_410._M_dataplus._M_p = (pointer)paVar41;
                }
                else {
                  local_410.field_2._M_allocated_capacity = *psVar30;
                  local_410._M_dataplus._M_p = (pointer)*puVar25;
                }
                local_410._M_string_length = puVar25[1];
                *puVar25 = psVar30;
                puVar25[1] = 0;
                *(undefined1 *)(puVar25 + 2) = 0;
                plVar23 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_410,
                                             (ulong)(pRVar43->name)._M_dataplus._M_p);
                local_3b8._0_8_ = local_3a8;
                pSVar17 = (SPIRVariable *)(plVar23 + 2);
                if ((SPIRVariable *)*plVar23 == pSVar17) {
                  local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                  local_3a8._8_8_ = plVar23[3];
                }
                else {
                  local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                  local_3b8._0_8_ = (SPIRVariable *)*plVar23;
                }
                local_3b8._8_8_ = plVar23[1];
                *plVar23 = (long)pSVar17;
                plVar23[1] = 0;
                *(undefined1 *)(plVar23 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
              }
              else {
                local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)(local_3a8 + 0x30),"void* ","");
                to_restrict(local_3c8,local_3bc.id,true);
                puVar25 = (undefined8 *)::std::__cxx11::string::append(local_3a8 + 0x30);
                local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                puVar31 = puVar25 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar25 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar31) {
                  local_3e8.field_2._M_allocated_capacity = *puVar31;
                  local_3e8.field_2._8_8_ = puVar25[3];
                }
                else {
                  local_3e8.field_2._M_allocated_capacity = *puVar31;
                  local_3e8._M_dataplus._M_p = (pointer)*puVar25;
                }
                local_3e8._M_string_length = puVar25[1];
                *puVar25 = puVar31;
                puVar25[1] = 0;
                *(undefined1 *)(puVar25 + 2) = 0;
                plVar23 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_3e8,
                                             (ulong)(pRVar43->name)._M_dataplus._M_p);
                psVar30 = (size_type *)(plVar23 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar23 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar30) {
                  local_410.field_2._M_allocated_capacity = *psVar30;
                  local_410.field_2._8_8_ = plVar23[3];
                  local_410._M_dataplus._M_p = (pointer)paVar41;
                }
                else {
                  local_410.field_2._M_allocated_capacity = *psVar30;
                  local_410._M_dataplus._M_p = (pointer)*plVar23;
                }
                local_410._M_string_length = plVar23[1];
                *plVar23 = (long)psVar30;
                plVar23[1] = 0;
                *(undefined1 *)(plVar23 + 2) = 0;
                plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
                local_3b8._0_8_ = local_3a8;
                pSVar17 = (SPIRVariable *)(plVar23 + 2);
                if ((SPIRVariable *)*plVar23 == pSVar17) {
                  local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                  local_3a8._8_8_ = plVar23[3];
                }
                else {
                  local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                  local_3b8._0_8_ = (SPIRVariable *)*plVar23;
                }
                local_3b8._8_8_ = plVar23[1];
                *plVar23 = (long)pSVar17;
                plVar23[1] = 0;
                *(undefined1 *)(plVar23 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
              }
              if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                operator_delete((void *)local_3b8._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_410._M_dataplus._M_p != paVar41) {
                operator_delete(local_410._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._M_dataplus._M_p != &local_378.field_2) {
                operator_delete(local_378._M_dataplus._M_p);
              }
              uVar39 = pRVar43->index;
              cVar14 = '\x01';
              if (9 < uVar39) {
                uVar33 = uVar39;
                cVar12 = '\x04';
                do {
                  cVar14 = cVar12;
                  if (uVar33 < 100) {
                    cVar14 = cVar14 + -2;
                    goto LAB_0025bced;
                  }
                  if (uVar33 < 1000) {
                    cVar14 = cVar14 + -1;
                    goto LAB_0025bced;
                  }
                  if (uVar33 < 10000) goto LAB_0025bced;
                  bVar13 = 99999 < uVar33;
                  uVar33 = uVar33 / 10000;
                  cVar12 = cVar14 + '\x04';
                } while (bVar13);
                cVar14 = cVar14 + '\x01';
              }
LAB_0025bced:
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar14);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar39);
              puVar25 = (undefined8 *)
                        ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3a35df);
              psVar30 = puVar25 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar30) {
                local_410.field_2._M_allocated_capacity = *psVar30;
                local_410.field_2._8_8_ = puVar25[3];
                local_410._M_dataplus._M_p = (pointer)paVar41;
              }
              else {
                local_410.field_2._M_allocated_capacity = *psVar30;
                local_410._M_dataplus._M_p = (pointer)*puVar25;
              }
              local_410._M_string_length = puVar25[1];
              *puVar25 = psVar30;
              puVar25[1] = 0;
              *(undefined1 *)(puVar25 + 2) = 0;
              plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
              local_3b8._0_8_ = local_3a8;
              pSVar17 = (SPIRVariable *)(plVar23 + 2);
              if ((SPIRVariable *)*plVar23 == pSVar17) {
                local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                local_3a8._8_8_ = plVar23[3];
              }
              else {
                local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                local_3b8._0_8_ = (SPIRVariable *)*plVar23;
              }
              local_3b8._8_8_ = plVar23[1];
              *plVar23 = (long)pSVar17;
              plVar23[1] = 0;
              *(undefined1 *)(plVar23 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
              if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                operator_delete((void *)local_3b8._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_410._M_dataplus._M_p != paVar41) {
                operator_delete(local_410._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p);
              }
              sVar18 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)local_358,&local_3bc.id);
              if (sVar18 != 0) {
                ::std::__cxx11::string::append((char *)local_3f0);
              }
              ::std::__cxx11::string::append((char *)local_3f0);
            }
            else {
              if (sVar3 != 1) {
                prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
                ::std::runtime_error::runtime_error
                          (prVar27,"Arrays of arrays of buffers are not supported.");
                *(undefined ***)prVar27 = &PTR__runtime_error_0049deb0;
                __cxa_throw(prVar27,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              local_3c8->is_using_builtin_array = true;
              bVar13 = is_var_runtime_size_array(local_3c8,pSVar17);
              if (bVar13) {
                add_spv_func_and_recompile(local_3c8,SPVFuncImplVariableDescriptorArray);
                if (local_3f0->_M_string_length != 0) {
                  ::std::__cxx11::string::append((char *)local_3f0);
                }
                bVar13 = Compiler::has_decoration((Compiler *)local_3c8,(ID)__k->id,BufferBlock);
                if (((~bVar13 & pSVar17->storage != StorageBuffer) == 0) &&
                   ((local_3c8->msl_options).runtime_array_rich_descriptor == true)) {
                  add_spv_func_and_recompile(local_3c8,SPVFuncImplVariableSizedDescriptor);
                  get_argument_address_space_abi_cxx11_(&local_328,local_3c8,pSVar17);
                  puVar25 = (undefined8 *)
                            ::std::__cxx11::string::replace
                                      ((ulong)&local_328,0,(char *)0x0,0x3a359b);
                  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
                  puVar31 = puVar25 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar25 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar31) {
                    local_378.field_2._M_allocated_capacity = *puVar31;
                    local_378.field_2._8_8_ = puVar25[3];
                  }
                  else {
                    local_378.field_2._M_allocated_capacity = *puVar31;
                    local_378._M_dataplus._M_p = (pointer)*puVar25;
                  }
                  local_378._M_string_length = puVar25[1];
                  *puVar25 = puVar31;
                  puVar25[1] = 0;
                  *(undefined1 *)(puVar25 + 2) = 0;
                  puVar25 = (undefined8 *)::std::__cxx11::string::append(local_3a8 + 0x30);
                  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                  puVar31 = puVar25 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar25 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar31) {
                    local_3e8.field_2._M_allocated_capacity = *puVar31;
                    local_3e8.field_2._8_8_ = puVar25[3];
                  }
                  else {
                    local_3e8.field_2._M_allocated_capacity = *puVar31;
                    local_3e8._M_dataplus._M_p = (pointer)*puVar25;
                  }
                  local_3e8._M_string_length = puVar25[1];
                  *puVar25 = puVar31;
                  puVar25[1] = 0;
                  *(undefined1 *)(puVar25 + 2) = 0;
                  (*(local_3c8->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (&local_350,local_3c8,pSVar40,0);
                  uVar36 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                    uVar36 = local_3e8.field_2._M_allocated_capacity;
                  }
                  uVar32 = (long)(uint32_t *)local_350._M_string_length + local_3e8._M_string_length
                  ;
                  in_R9 = &local_350;
                  if ((ulong)uVar36 < uVar32) {
                    uVar36 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_350._M_dataplus._M_p != &local_350.field_2) {
                      uVar36 = local_350.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar36 < uVar32) goto LAB_0025c012;
                    puVar25 = (undefined8 *)
                              ::std::__cxx11::string::replace
                                        ((ulong)in_R9,0,(char *)0x0,
                                         (ulong)local_3e8._M_dataplus._M_p);
                  }
                  else {
LAB_0025c012:
                    puVar25 = (undefined8 *)
                              ::std::__cxx11::string::_M_append
                                        ((char *)&local_3e8,(ulong)local_350._M_dataplus._M_p);
                  }
                  psVar30 = puVar25 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar25 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar30) {
                    local_410.field_2._M_allocated_capacity = *psVar30;
                    local_410.field_2._8_8_ = puVar25[3];
                    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
                  }
                  else {
                    local_410.field_2._M_allocated_capacity = *psVar30;
                    local_410._M_dataplus._M_p = (pointer)*puVar25;
                  }
                  local_410._M_string_length = puVar25[1];
                  *puVar25 = psVar30;
                  puVar25[1] = 0;
                  *(undefined1 *)psVar30 = 0;
                  plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
                  local_3b8._0_8_ = local_3a8;
                  pSVar17 = (SPIRVariable *)(plVar23 + 2);
                  if ((SPIRVariable *)*plVar23 == pSVar17) {
                    local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                    local_3a8._8_8_ = plVar23[3];
                  }
                  else {
                    local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                    local_3b8._0_8_ = (SPIRVariable *)*plVar23;
                  }
                  local_3b8._8_8_ = plVar23[1];
                  *plVar23 = (long)pSVar17;
                  plVar23[1] = 0;
                  *(undefined1 *)(plVar23 + 2) = 0;
                  ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
                }
                else {
                  add_spv_func_and_recompile(local_3c8,SPVFuncImplVariableDescriptor);
                  get_argument_address_space_abi_cxx11_(&local_328,local_3c8,pSVar17);
                  puVar25 = (undefined8 *)
                            ::std::__cxx11::string::replace
                                      ((ulong)&local_328,0,(char *)0x0,0x3a35c2);
                  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
                  puVar31 = puVar25 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar25 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar31) {
                    local_378.field_2._M_allocated_capacity = *puVar31;
                    local_378.field_2._8_8_ = puVar25[3];
                  }
                  else {
                    local_378.field_2._M_allocated_capacity = *puVar31;
                    local_378._M_dataplus._M_p = (pointer)*puVar25;
                  }
                  local_378._M_string_length = puVar25[1];
                  *puVar25 = puVar31;
                  puVar25[1] = 0;
                  *(undefined1 *)(puVar25 + 2) = 0;
                  puVar25 = (undefined8 *)::std::__cxx11::string::append(local_3a8 + 0x30);
                  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                  puVar31 = puVar25 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar25 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar31) {
                    local_3e8.field_2._M_allocated_capacity = *puVar31;
                    local_3e8.field_2._8_8_ = puVar25[3];
                  }
                  else {
                    local_3e8.field_2._M_allocated_capacity = *puVar31;
                    local_3e8._M_dataplus._M_p = (pointer)*puVar25;
                  }
                  local_3e8._M_string_length = puVar25[1];
                  *puVar25 = puVar31;
                  puVar25[1] = 0;
                  *(undefined1 *)(puVar25 + 2) = 0;
                  (*(local_3c8->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (&local_350,local_3c8,pSVar40,0);
                  uVar36 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                    uVar36 = local_3e8.field_2._M_allocated_capacity;
                  }
                  uVar32 = (long)(uint32_t *)local_350._M_string_length + local_3e8._M_string_length
                  ;
                  in_R9 = &local_350;
                  if ((ulong)uVar36 < uVar32) {
                    uVar36 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_350._M_dataplus._M_p != &local_350.field_2) {
                      uVar36 = local_350.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar36 < uVar32) goto LAB_0025bba9;
                    puVar25 = (undefined8 *)
                              ::std::__cxx11::string::replace
                                        ((ulong)in_R9,0,(char *)0x0,
                                         (ulong)local_3e8._M_dataplus._M_p);
                  }
                  else {
LAB_0025bba9:
                    puVar25 = (undefined8 *)
                              ::std::__cxx11::string::_M_append
                                        ((char *)&local_3e8,(ulong)local_350._M_dataplus._M_p);
                  }
                  psVar30 = puVar25 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar25 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar30) {
                    local_410.field_2._M_allocated_capacity = *psVar30;
                    local_410.field_2._8_8_ = puVar25[3];
                    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
                  }
                  else {
                    local_410.field_2._M_allocated_capacity = *psVar30;
                    local_410._M_dataplus._M_p = (pointer)*puVar25;
                  }
                  local_410._M_string_length = puVar25[1];
                  *puVar25 = psVar30;
                  puVar25[1] = 0;
                  *(undefined1 *)psVar30 = 0;
                  plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
                  local_3b8._0_8_ = local_3a8;
                  pSVar17 = (SPIRVariable *)(plVar23 + 2);
                  if ((SPIRVariable *)*plVar23 == pSVar17) {
                    local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                    local_3a8._8_8_ = plVar23[3];
                  }
                  else {
                    local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                    local_3b8._0_8_ = (SPIRVariable *)*plVar23;
                  }
                  local_3b8._8_8_ = plVar23[1];
                  *plVar23 = (long)pSVar17;
                  plVar23[1] = 0;
                  *(undefined1 *)(plVar23 + 2) = 0;
                  ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
                }
                paVar41 = &local_410.field_2;
                if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                  operator_delete((void *)local_3b8._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_410._M_dataplus._M_p != paVar41) {
                  operator_delete(local_410._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) {
                  operator_delete(local_350._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                  operator_delete(local_3e8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_378._M_dataplus._M_p != &local_378.field_2) {
                  operator_delete(local_378._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_dataplus._M_p != &local_328.field_2) {
                  operator_delete(local_328._M_dataplus._M_p);
                }
                __lhs = to_restrict(local_3c8,local_3bc.id,true);
                ::std::operator+(&local_410,__lhs,&pRVar43->name);
                plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
                local_3b8._0_8_ = local_3a8;
                pSVar17 = (SPIRVariable *)(plVar23 + 2);
                if ((SPIRVariable *)*plVar23 == pSVar17) {
                  local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                  local_3a8._8_8_ = plVar23[3];
                }
                else {
                  local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                  local_3b8._0_8_ = (SPIRVariable *)*plVar23;
                }
                local_3b8._8_8_ = plVar23[1];
                *plVar23 = (long)pSVar17;
                plVar23[1] = 0;
                *(undefined1 *)(plVar23 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
                if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                  operator_delete((void *)local_3b8._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_410._M_dataplus._M_p != paVar41) {
                  operator_delete(local_410._M_dataplus._M_p);
                }
                uVar39 = pRVar43->index;
                cVar14 = '\x01';
                if (9 < uVar39) {
                  uVar33 = uVar39;
                  cVar12 = '\x04';
                  do {
                    cVar14 = cVar12;
                    if (uVar33 < 100) {
                      cVar14 = cVar14 + -2;
                      goto LAB_0025c265;
                    }
                    if (uVar33 < 1000) {
                      cVar14 = cVar14 + -1;
                      goto LAB_0025c265;
                    }
                    if (uVar33 < 10000) goto LAB_0025c265;
                    bVar13 = 99999 < uVar33;
                    uVar33 = uVar33 / 10000;
                    cVar12 = cVar14 + '\x04';
                  } while (bVar13);
                  cVar14 = cVar14 + '\x01';
                }
LAB_0025c265:
                local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar14);
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar39);
                puVar25 = (undefined8 *)
                          ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3a35df);
                psVar30 = puVar25 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar25 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar30) {
                  local_410.field_2._M_allocated_capacity = *psVar30;
                  local_410.field_2._8_8_ = puVar25[3];
                  local_410._M_dataplus._M_p = (pointer)paVar41;
                }
                else {
                  local_410.field_2._M_allocated_capacity = *psVar30;
                  local_410._M_dataplus._M_p = (pointer)*puVar25;
                }
                local_410._M_string_length = puVar25[1];
                *puVar25 = psVar30;
                puVar25[1] = 0;
                *(undefined1 *)(puVar25 + 2) = 0;
                plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
                local_3b8._0_8_ = local_3a8;
                pSVar17 = (SPIRVariable *)(plVar23 + 2);
                if ((SPIRVariable *)*plVar23 == pSVar17) {
                  local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                  local_3a8._8_8_ = plVar23[3];
                }
                else {
                  local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
                  local_3b8._0_8_ = (SPIRVariable *)*plVar23;
                }
                local_3b8._8_8_ = plVar23[1];
                *plVar23 = (long)pSVar17;
                plVar23[1] = 0;
                *(undefined1 *)(plVar23 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
                if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                  operator_delete((void *)local_3b8._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_410._M_dataplus._M_p != paVar41) {
                  operator_delete(local_410._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                  operator_delete(local_3e8._M_dataplus._M_p);
                }
                sVar18 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)local_358,&local_3bc.id);
                if (sVar18 != 0) {
                  ::std::__cxx11::string::append((char *)local_3f0);
                }
                ::std::__cxx11::string::append((char *)local_3f0);
              }
              else {
                uVar15 = get_resource_array_size(local_3c8,pSVar40,local_3bc.id);
                if (uVar15 != 0) {
                  uVar39 = 0;
                  local_2f0 = pSVar40;
                  do {
                    if (local_3f0->_M_string_length != 0) {
                      ::std::__cxx11::string::append((char *)local_3f0);
                    }
                    get_argument_address_space_abi_cxx11_(&local_268,local_3c8,pSVar17);
                    plVar23 = (long *)::std::__cxx11::string::append((char *)&local_268);
                    local_2b8 = &local_2a8;
                    puVar31 = (ulong *)(plVar23 + 2);
                    if ((ulong *)*plVar23 == puVar31) {
                      local_2a8 = *puVar31;
                      uStack_2a0 = (undefined4)plVar23[3];
                      uStack_29c = *(undefined4 *)((long)plVar23 + 0x1c);
                    }
                    else {
                      local_2a8 = *puVar31;
                      local_2b8 = (ulong *)*plVar23;
                    }
                    local_2b0 = plVar23[1];
                    *plVar23 = (long)puVar31;
                    plVar23[1] = 0;
                    *(undefined1 *)(plVar23 + 2) = 0;
                    (*(local_3c8->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                              (&local_298,local_3c8,pSVar40,0);
                    uVar32 = 0xf;
                    if (local_2b8 != &local_2a8) {
                      uVar32 = local_2a8;
                    }
                    if (uVar32 < (ulong)(local_290 + local_2b0)) {
                      uVar32 = 0xf;
                      if (local_298 != local_288) {
                        uVar32 = local_288[0];
                      }
                      if (uVar32 < (ulong)(local_290 + local_2b0)) goto LAB_0025a730;
                      puVar25 = (undefined8 *)
                                ::std::__cxx11::string::replace
                                          ((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
                    }
                    else {
LAB_0025a730:
                      puVar25 = (undefined8 *)
                                ::std::__cxx11::string::_M_append
                                          ((char *)&local_2b8,(ulong)local_298);
                    }
                    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
                    puVar31 = puVar25 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar25 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar31) {
                      local_350.field_2._M_allocated_capacity = *puVar31;
                      local_350.field_2._8_8_ = puVar25[3];
                    }
                    else {
                      local_350.field_2._M_allocated_capacity = *puVar31;
                      local_350._M_dataplus._M_p = (pointer)*puVar25;
                    }
                    local_350._M_string_length = puVar25[1];
                    *puVar25 = puVar31;
                    puVar25[1] = 0;
                    *(undefined1 *)puVar31 = 0;
                    puVar25 = (undefined8 *)::std::__cxx11::string::append((char *)&local_350);
                    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
                    psVar30 = puVar25 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar25 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar30) {
                      local_328.field_2._M_allocated_capacity = *psVar30;
                      local_328.field_2._8_8_ = puVar25[3];
                    }
                    else {
                      local_328.field_2._M_allocated_capacity = *psVar30;
                      local_328._M_dataplus._M_p = (pointer)*puVar25;
                    }
                    local_328._M_string_length = puVar25[1];
                    *puVar25 = psVar30;
                    puVar25[1] = 0;
                    *(undefined1 *)(puVar25 + 2) = 0;
                    to_restrict(local_3c8,local_3bc.id,true);
                    puVar25 = (undefined8 *)::std::__cxx11::string::append((char *)&local_328);
                    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
                    puVar31 = puVar25 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar25 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar31) {
                      local_378.field_2._M_allocated_capacity = *puVar31;
                      local_378.field_2._8_8_ = puVar25[3];
                    }
                    else {
                      local_378.field_2._M_allocated_capacity = *puVar31;
                      local_378._M_dataplus._M_p = (pointer)*puVar25;
                    }
                    local_378._M_string_length = puVar25[1];
                    *puVar25 = puVar31;
                    puVar25[1] = 0;
                    *(undefined1 *)(puVar25 + 2) = 0;
                    puVar25 = (undefined8 *)
                              ::std::__cxx11::string::_M_append
                                        (local_3a8 + 0x30,(ulong)(pRVar43->name)._M_dataplus._M_p);
                    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                    puVar31 = puVar25 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar25 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar31) {
                      local_3e8.field_2._M_allocated_capacity = *puVar31;
                      local_3e8.field_2._8_8_ = puVar25[3];
                    }
                    else {
                      local_3e8.field_2._M_allocated_capacity = *puVar31;
                      local_3e8._M_dataplus._M_p = (pointer)*puVar25;
                    }
                    local_3e8._M_string_length = puVar25[1];
                    *puVar25 = puVar31;
                    puVar25[1] = 0;
                    *(undefined1 *)(puVar25 + 2) = 0;
                    plVar23 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
                    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
                    puVar31 = (ulong *)(plVar23 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar23 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar31) {
                      local_410.field_2._M_allocated_capacity = *puVar31;
                      local_410.field_2._8_8_ = plVar23[3];
                    }
                    else {
                      local_410.field_2._M_allocated_capacity = *puVar31;
                      local_410._M_dataplus._M_p = (pointer)*plVar23;
                    }
                    local_410._M_string_length = plVar23[1];
                    *plVar23 = (long)puVar31;
                    plVar23[1] = 0;
                    *(undefined1 *)(plVar23 + 2) = 0;
                    cVar14 = '\x01';
                    if (9 < uVar39) {
                      uVar32 = (ulong)uVar39;
                      cVar12 = '\x04';
                      do {
                        cVar14 = cVar12;
                        uVar33 = (uint)uVar32;
                        if (uVar33 < 100) {
                          cVar14 = cVar14 + -2;
                          goto LAB_0025a992;
                        }
                        if (uVar33 < 1000) {
                          cVar14 = cVar14 + -1;
                          goto LAB_0025a992;
                        }
                        if (uVar33 < 10000) goto LAB_0025a992;
                        uVar32 = uVar32 / 10000;
                        cVar12 = cVar14 + '\x04';
                      } while (99999 < uVar33);
                      cVar14 = cVar14 + '\x01';
                    }
LAB_0025a992:
                    local_2d8 = local_2c8;
                    ::std::__cxx11::string::_M_construct((ulong)&local_2d8,cVar14);
                    ::std::__detail::__to_chars_10_impl<unsigned_int>
                              ((char *)local_2d8,local_2d0,uVar39);
                    uVar36 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_410._M_dataplus._M_p != &local_410.field_2) {
                      uVar36 = local_410.field_2._M_allocated_capacity;
                    }
                    uVar32 = CONCAT44(uStack_2cc,local_2d0) + local_410._M_string_length;
                    if ((ulong)uVar36 < uVar32) {
                      uVar37 = 0xf;
                      if (local_2d8 != local_2c8) {
                        uVar37 = local_2c8[0];
                      }
                      if (uVar37 < uVar32) goto LAB_0025aa1d;
                      plVar23 = (long *)::std::__cxx11::string::replace
                                                  ((ulong)&local_2d8,0,(char *)0x0,
                                                   (ulong)local_410._M_dataplus._M_p);
                    }
                    else {
LAB_0025aa1d:
                      plVar23 = (long *)::std::__cxx11::string::_M_append
                                                  ((char *)&local_410,(ulong)local_2d8);
                    }
                    local_3b8._0_8_ = local_3a8;
                    pSVar22 = (SPIRVariable *)(plVar23 + 2);
                    if ((SPIRVariable *)*plVar23 == pSVar22) {
                      local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
                      local_3a8._8_8_ = plVar23[3];
                    }
                    else {
                      local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
                      local_3b8._0_8_ = (SPIRVariable *)*plVar23;
                    }
                    local_3b8._8_8_ = plVar23[1];
                    *plVar23 = (long)pSVar22;
                    plVar23[1] = 0;
                    *(undefined1 *)&(pSVar22->super_IVariant)._vptr_IVariant = 0;
                    ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
                    if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                      operator_delete((void *)local_3b8._0_8_);
                    }
                    if (local_2d8 != local_2c8) {
                      operator_delete(local_2d8);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_410._M_dataplus._M_p != &local_410.field_2) {
                      operator_delete(local_410._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                      operator_delete(local_3e8._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_378._M_dataplus._M_p != &local_378.field_2) {
                      operator_delete(local_378._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p != &local_328.field_2) {
                      operator_delete(local_328._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_350._M_dataplus._M_p != &local_350.field_2) {
                      operator_delete(local_350._M_dataplus._M_p);
                    }
                    if (local_298 != local_288) {
                      operator_delete(local_298);
                    }
                    if (local_2b8 != &local_2a8) {
                      operator_delete(local_2b8);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_268._M_dataplus._M_p != &local_268.field_2) {
                      operator_delete(local_268._M_dataplus._M_p);
                    }
                    uVar33 = pRVar43->index + uVar39;
                    cVar14 = '\x01';
                    if (9 < uVar33) {
                      uVar28 = uVar33;
                      cVar12 = '\x04';
                      do {
                        cVar14 = cVar12;
                        if (uVar28 < 100) {
                          cVar14 = cVar14 + -2;
                          goto LAB_0025abe5;
                        }
                        if (uVar28 < 1000) {
                          cVar14 = cVar14 + -1;
                          goto LAB_0025abe5;
                        }
                        if (uVar28 < 10000) goto LAB_0025abe5;
                        bVar13 = 99999 < uVar28;
                        uVar28 = uVar28 / 10000;
                        cVar12 = cVar14 + '\x04';
                      } while (bVar13);
                      cVar14 = cVar14 + '\x01';
                    }
LAB_0025abe5:
                    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                    ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar14);
                    ::std::__detail::__to_chars_10_impl<unsigned_int>
                              (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar33);
                    puVar25 = (undefined8 *)
                              ::std::__cxx11::string::replace
                                        ((ulong)&local_3e8,0,(char *)0x0,0x3a35df);
                    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
                    psVar30 = puVar25 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar25 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar30) {
                      local_410.field_2._M_allocated_capacity = *psVar30;
                      local_410.field_2._8_8_ = puVar25[3];
                    }
                    else {
                      local_410.field_2._M_allocated_capacity = *psVar30;
                      local_410._M_dataplus._M_p = (pointer)*puVar25;
                    }
                    local_410._M_string_length = puVar25[1];
                    *puVar25 = psVar30;
                    puVar25[1] = 0;
                    *(undefined1 *)(puVar25 + 2) = 0;
                    plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
                    pSVar40 = local_2f0;
                    local_3b8._0_8_ = local_3a8;
                    pSVar22 = (SPIRVariable *)(plVar23 + 2);
                    if ((SPIRVariable *)*plVar23 == pSVar22) {
                      local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
                      local_3a8._8_8_ = plVar23[3];
                    }
                    else {
                      local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
                      local_3b8._0_8_ = (SPIRVariable *)*plVar23;
                    }
                    local_3b8._8_8_ = plVar23[1];
                    *plVar23 = (long)pSVar22;
                    plVar23[1] = 0;
                    *(undefined1 *)(plVar23 + 2) = 0;
                    ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
                    if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                      operator_delete((void *)local_3b8._0_8_);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_410._M_dataplus._M_p != &local_410.field_2) {
                      operator_delete(local_410._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                      operator_delete(local_3e8._M_dataplus._M_p);
                    }
                    sVar18 = ::std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                      *)local_358,&local_3bc.id);
                    if (sVar18 != 0) {
                      ::std::__cxx11::string::append((char *)local_3f0);
                    }
                    ::std::__cxx11::string::append((char *)local_3f0);
                    uVar39 = uVar39 + 1;
                  } while (uVar39 != uVar15);
                }
              }
              local_3c8->is_using_builtin_array = false;
            }
          }
          else {
            if (pRVar43->var == pRVar43->discrete_descriptor_alias) {
              uVar15 = Compiler::get_decoration
                                 ((Compiler *)local_3c8,local_3bc,DecorationDescriptorSet);
              local_410._M_dataplus._M_p._0_4_ = uVar15;
              uVar15 = Compiler::get_decoration((Compiler *)pCVar10,local_3bc,Binding);
              paVar41 = &local_410.field_2;
              local_3e8._M_dataplus._M_p._0_4_ = uVar15;
              join<char_const(&)[18],unsigned_int,char_const(&)[8],unsigned_int>
                        ((string *)local_3b8,(spirv_cross *)"spvBufferAliasSet",
                         (char (*) [18])&local_410,(uint *)"Binding",(char (*) [8])&local_3e8,
                         (uint *)in_R9);
              if (local_3f0->_M_string_length != 0) {
                ::std::__cxx11::string::append((char *)local_3f0);
              }
              get_argument_address_space_abi_cxx11_((string *)(local_3a8 + 0x30),local_3c8,pSVar17);
              plVar23 = (long *)::std::__cxx11::string::append((char *)(local_3a8 + 0x30));
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              psVar30 = (size_type *)(plVar23 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar30) {
                local_3e8.field_2._M_allocated_capacity = *psVar30;
                local_3e8.field_2._8_8_ = plVar23[3];
              }
              else {
                local_3e8.field_2._M_allocated_capacity = *psVar30;
                local_3e8._M_dataplus._M_p = (pointer)*plVar23;
              }
              local_3e8._M_string_length = plVar23[1];
              *plVar23 = (long)psVar30;
              plVar23[1] = 0;
              *(undefined1 *)(plVar23 + 2) = 0;
              plVar23 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_3e8,local_3b8._0_8_);
              psVar30 = (size_type *)(plVar23 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar23 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar30) {
                local_410.field_2._M_allocated_capacity = *psVar30;
                local_410.field_2._8_8_ = plVar23[3];
                local_410._M_dataplus._M_p = (pointer)paVar41;
              }
              else {
                local_410.field_2._M_allocated_capacity = *psVar30;
                local_410._M_dataplus._M_p = (pointer)*plVar23;
              }
              local_410._M_string_length = plVar23[1];
              *plVar23 = (long)psVar30;
              plVar23[1] = 0;
              *(undefined1 *)(plVar23 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_410._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_410._M_dataplus._M_p != paVar41) {
                operator_delete(local_410._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._M_dataplus._M_p != &local_378.field_2) {
                operator_delete(local_378._M_dataplus._M_p);
              }
              uVar39 = pRVar43->index;
              cVar14 = '\x01';
              if (9 < uVar39) {
                uVar33 = uVar39;
                cVar12 = '\x04';
                do {
                  cVar14 = cVar12;
                  if (uVar33 < 100) {
                    cVar14 = cVar14 + -2;
                    goto LAB_0025b876;
                  }
                  if (uVar33 < 1000) {
                    cVar14 = cVar14 + -1;
                    goto LAB_0025b876;
                  }
                  if (uVar33 < 10000) goto LAB_0025b876;
                  bVar13 = 99999 < uVar33;
                  uVar33 = uVar33 / 10000;
                  cVar12 = cVar14 + '\x04';
                } while (bVar13);
                cVar14 = cVar14 + '\x01';
              }
LAB_0025b876:
              local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
              ::std::__cxx11::string::_M_construct((ulong)(local_3a8 + 0x30),cVar14);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_378._M_dataplus._M_p,(uint)local_378._M_string_length,uVar39);
              puVar25 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)(local_3a8 + 0x30),0,(char *)0x0,0x3a35df);
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              puVar31 = puVar25 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar31) {
                local_3e8.field_2._M_allocated_capacity = *puVar31;
                local_3e8.field_2._8_8_ = puVar25[3];
              }
              else {
                local_3e8.field_2._M_allocated_capacity = *puVar31;
                local_3e8._M_dataplus._M_p = (pointer)*puVar25;
              }
              local_3e8._M_string_length = puVar25[1];
              *puVar25 = puVar31;
              puVar25[1] = 0;
              *(undefined1 *)(puVar25 + 2) = 0;
              puVar25 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3e8);
              psVar30 = puVar25 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar30) {
                local_410.field_2._M_allocated_capacity = *psVar30;
                local_410.field_2._8_8_ = puVar25[3];
                local_410._M_dataplus._M_p = (pointer)paVar41;
              }
              else {
                local_410.field_2._M_allocated_capacity = *psVar30;
                local_410._M_dataplus._M_p = (pointer)*puVar25;
              }
              local_410._M_string_length = puVar25[1];
              *puVar25 = psVar30;
              puVar25[1] = 0;
              *(undefined1 *)(puVar25 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_410._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_410._M_dataplus._M_p != paVar41) {
                operator_delete(local_410._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._M_dataplus._M_p != &local_378.field_2) {
                operator_delete(local_378._M_dataplus._M_p);
              }
              sVar18 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)local_358,&local_3bc.id);
              if (sVar18 != 0) {
                ::std::__cxx11::string::append((char *)local_3f0);
              }
              ::std::__cxx11::string::append((char *)local_3f0);
              if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
                operator_delete((void *)local_3b8._0_8_);
              }
            }
            pCVar10 = local_3c8;
            uVar39 = (pRVar43->var->super_IVariant).self.id;
            SmallVector<unsigned_int,_8UL>::reserve
                      ((SmallVector<unsigned_int,_8UL> *)local_308,
                       (local_3c8->buffer_aliases_discrete).super_VectorView<unsigned_int>.
                       buffer_size + 1);
            sVar3 = (pCVar10->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size;
            (pCVar10->buffer_aliases_discrete).super_VectorView<unsigned_int>.ptr[sVar3] = uVar39;
            (pCVar10->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size =
                 sVar3 + 1;
          }
        }
        break;
      case Image:
        if (local_3f0->_M_string_length != 0) {
          ::std::__cxx11::string::append((char *)local_3f0);
        }
        pSVar24 = Variant::get<spirv_cross::SPIRType>
                            ((local_3c8->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)&(pSVar17->super_IVariant).field_0xc);
        if (((pSVar24->basetype == Image) && ((pSVar24->image).dim == DimSubpassData)) &&
           ((local_3c8->msl_options).use_framebuffer_fetch_subpasses != false)) {
          if (((local_3c8->msl_options).platform == macOS) &&
             ((local_3c8->msl_options).msl_version < 0x4f4c)) {
            prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (prVar27,"Framebuffer fetch on Mac is not supported before MSL 2.3.");
            *(undefined ***)prVar27 = &PTR__runtime_error_0049deb0;
            __cxa_throw(prVar27,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          (*(local_3c8->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                    (&local_3e8,local_3c8,pSVar40,(ulong)local_3bc.id,0);
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          psVar30 = (size_type *)(plVar23 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410.field_2._8_8_ = plVar23[3];
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410._M_dataplus._M_p = (pointer)*plVar23;
          }
          local_410._M_string_length = plVar23[1];
          *plVar23 = (long)psVar30;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_410,(ulong)(pRVar43->name)._M_dataplus._M_p);
          local_3b8._0_8_ = local_3a8;
          pSVar22 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar22) {
            local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar22;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          uVar39 = pRVar43->index;
          cVar14 = '\x01';
          if (9 < uVar39) {
            uVar33 = uVar39;
            cVar12 = '\x04';
            do {
              cVar14 = cVar12;
              if (uVar33 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_0025b64b;
              }
              if (uVar33 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_0025b64b;
              }
              if (uVar33 < 10000) goto LAB_0025b64b;
              bVar13 = 99999 < uVar33;
              uVar33 = uVar33 / 10000;
              cVar12 = cVar14 + '\x04';
            } while (bVar13);
            cVar14 = cVar14 + '\x01';
          }
LAB_0025b64b:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar14);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar39);
          puVar25 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3a3399);
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          psVar30 = puVar25 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410.field_2._8_8_ = puVar25[3];
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410._M_dataplus._M_p = (pointer)*puVar25;
          }
          local_410._M_string_length = puVar25[1];
          *puVar25 = psVar30;
          puVar25[1] = 0;
          *(undefined1 *)(puVar25 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3b8._0_8_ = local_3a8;
          pSVar22 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar22) {
            local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar22;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
        }
        else {
          (*(local_3c8->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                    (&local_3e8,local_3c8,pSVar40,(ulong)local_3bc.id,0);
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          psVar30 = (size_type *)(plVar23 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410.field_2._8_8_ = plVar23[3];
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410._M_dataplus._M_p = (pointer)*plVar23;
          }
          local_410._M_string_length = plVar23[1];
          *plVar23 = (long)psVar30;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_410,(ulong)(pRVar43->name)._M_dataplus._M_p);
          local_3b8._0_8_ = local_3a8;
          pSVar22 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar22) {
            local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar22;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          if (pRVar43->plane != 0) {
            join<std::__cxx11::string&,unsigned_int&>
                      ((string *)local_3b8,(spirv_cross *)local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pRVar43->plane,(uint *)pSVar22);
            ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
            if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
              operator_delete((void *)local_3b8._0_8_);
            }
          }
          bVar13 = is_var_runtime_size_array(local_3c8,pSVar17);
          if (bVar13) {
            uVar39 = pRVar43->index;
            cVar14 = '\x01';
            if (9 < uVar39) {
              uVar33 = uVar39;
              cVar12 = '\x04';
              do {
                cVar14 = cVar12;
                if (uVar33 < 100) {
                  cVar14 = cVar14 + -2;
                  goto LAB_0025aeb3;
                }
                if (uVar33 < 1000) {
                  cVar14 = cVar14 + -1;
                  goto LAB_0025aeb3;
                }
                if (uVar33 < 10000) goto LAB_0025aeb3;
                bVar13 = 99999 < uVar33;
                uVar33 = uVar33 / 10000;
                cVar12 = cVar14 + '\x04';
              } while (bVar13);
              cVar14 = cVar14 + '\x01';
            }
LAB_0025aeb3:
            local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar14);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar39);
            puVar25 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3a35de);
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
            psVar30 = puVar25 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar25 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar30) {
              local_410.field_2._M_allocated_capacity = *psVar30;
              local_410.field_2._8_8_ = puVar25[3];
            }
            else {
              local_410.field_2._M_allocated_capacity = *psVar30;
              local_410._M_dataplus._M_p = (pointer)*puVar25;
            }
            local_410._M_string_length = puVar25[1];
            *puVar25 = psVar30;
            puVar25[1] = 0;
            *(undefined1 *)(puVar25 + 2) = 0;
            plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
            local_3b8._0_8_ = local_3a8;
            pSVar22 = (SPIRVariable *)(plVar23 + 2);
            if ((SPIRVariable *)*plVar23 == pSVar22) {
              local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3a8._8_8_ = plVar23[3];
            }
            else {
              local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3b8._0_8_ = (SPIRVariable *)*plVar23;
            }
            local_3b8._8_8_ = plVar23[1];
            *plVar23 = (long)pSVar22;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
          }
          else {
            uVar39 = pRVar43->index;
            cVar14 = '\x01';
            if (9 < uVar39) {
              uVar33 = uVar39;
              cVar12 = '\x04';
              do {
                cVar14 = cVar12;
                if (uVar33 < 100) {
                  cVar14 = cVar14 + -2;
                  goto LAB_0025afb8;
                }
                if (uVar33 < 1000) {
                  cVar14 = cVar14 + -1;
                  goto LAB_0025afb8;
                }
                if (uVar33 < 10000) goto LAB_0025afb8;
                bVar13 = 99999 < uVar33;
                uVar33 = uVar33 / 10000;
                cVar12 = cVar14 + '\x04';
              } while (bVar13);
              cVar14 = cVar14 + '\x01';
            }
LAB_0025afb8:
            local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar14);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar39);
            puVar25 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3a35f6);
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
            psVar30 = puVar25 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar25 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar30) {
              local_410.field_2._M_allocated_capacity = *psVar30;
              local_410.field_2._8_8_ = puVar25[3];
            }
            else {
              local_410.field_2._M_allocated_capacity = *psVar30;
              local_410._M_dataplus._M_p = (pointer)*puVar25;
            }
            local_410._M_string_length = puVar25[1];
            *puVar25 = psVar30;
            puVar25[1] = 0;
            *(undefined1 *)(puVar25 + 2) = 0;
            plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
            local_3b8._0_8_ = local_3a8;
            pSVar22 = (SPIRVariable *)(plVar23 + 2);
            if ((SPIRVariable *)*plVar23 == pSVar22) {
              local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3a8._8_8_ = plVar23[3];
            }
            else {
              local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
              local_3b8._0_8_ = (SPIRVariable *)*plVar23;
            }
            local_3b8._8_8_ = plVar23[1];
            *plVar23 = (long)pSVar22;
            plVar23[1] = 0;
            *(undefined1 *)(plVar23 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
          }
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          sVar18 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)local_358,&local_3bc.id);
          if (sVar18 != 0) {
            ::std::__cxx11::string::append((char *)local_3f0);
          }
          ::std::__cxx11::string::append((char *)local_3f0);
        }
        local_3b8._0_4_ = (pSVar17->super_IVariant).self.id;
        sVar18 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)local_2f8,(key_type *)local_3b8);
        if (sVar18 != 0) {
          pBVar26 = ParsedIR::get_decoration_bitset(local_270,(ID)(pSVar17->super_IVariant).self.id)
          ;
          pCVar10 = local_3c8;
          local_378._M_dataplus._M_p = "volatile ";
          if ((pBVar26->lower & 0xa00000) == 0) {
            local_378._M_dataplus._M_p = "";
          }
          pSVar40 = Variant::get<spirv_cross::SPIRType>
                              ((local_3c8->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + (pSVar24->image).type.id
                              );
          (*(pCVar10->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_410,pCVar10,pSVar40,0);
          paVar41 = &local_410.field_2;
          join<char_const(&)[3],char_const*&,char_const(&)[15],std::__cxx11::string>
                    ((string *)local_3b8,(spirv_cross *)0x3a2bb2,(char (*) [3])(local_3a8 + 0x30),
                     (char **)"device atomic_",(char (*) [15])&local_410,in_R9);
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != paVar41) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          ::std::operator+(&local_410,"* ",&pRVar43->name);
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3b8._0_8_ = local_3a8;
          pSVar17 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar17) {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar17;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != paVar41) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          uVar39 = pRVar43->secondary_index;
          cVar14 = '\x01';
          if (9 < uVar39) {
            uVar33 = uVar39;
            cVar12 = '\x04';
            do {
              cVar14 = cVar12;
              if (uVar33 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_0025b300;
              }
              if (uVar33 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_0025b300;
              }
              if (uVar33 < 10000) goto LAB_0025b300;
              bVar13 = 99999 < uVar33;
              uVar33 = uVar33 / 10000;
              cVar12 = cVar14 + '\x04';
            } while (bVar13);
            cVar14 = cVar14 + '\x01';
          }
LAB_0025b300:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar14);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar39);
          puVar25 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3a35df);
          psVar30 = puVar25 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410.field_2._8_8_ = puVar25[3];
            local_410._M_dataplus._M_p = (pointer)paVar41;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410._M_dataplus._M_p = (pointer)*puVar25;
          }
          local_410._M_string_length = puVar25[1];
          *puVar25 = psVar30;
          puVar25[1] = 0;
          *(undefined1 *)(puVar25 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3b8._0_8_ = local_3a8;
          pSVar17 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar17) {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar17;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != paVar41) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          sVar18 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)local_358,&local_3bc.id);
          if (sVar18 != 0) {
            ::std::__cxx11::string::append((char *)local_3f0);
          }
          ::std::__cxx11::string::append((char *)local_3f0);
        }
        break;
      default:
        if (local_3f0->_M_string_length != 0) {
          ::std::__cxx11::string::append((char *)local_3f0);
        }
        pCVar10 = local_3c8;
        if (pSVar40->pointer == false) {
          pSVar24 = Variant::get<spirv_cross::SPIRType>
                              ((local_3c8->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar17->super_IVariant).field_0xc);
          get_type_address_space_abi_cxx11_(&local_328,pCVar10,pSVar24,local_3bc.id,false);
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_328);
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          puVar31 = (ulong *)(plVar23 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar31) {
            local_378.field_2._M_allocated_capacity = *puVar31;
            local_378.field_2._8_8_ = plVar23[3];
          }
          else {
            local_378.field_2._M_allocated_capacity = *puVar31;
            local_378._M_dataplus._M_p = (pointer)*plVar23;
          }
          local_378._M_string_length = plVar23[1];
          *plVar23 = (long)puVar31;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          (*(local_3c8->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_350,local_3c8,pSVar40,(ulong)local_3bc.id);
          uVar36 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            uVar36 = local_378.field_2._M_allocated_capacity;
          }
          uVar32 = (long)(uint32_t *)local_350._M_string_length + local_378._M_string_length;
          in_R9 = &local_350;
          if ((ulong)uVar36 < uVar32) {
            uVar36 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_dataplus._M_p != &local_350.field_2) {
              uVar36 = local_350.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar36 < uVar32) goto LAB_002598d7;
            puVar25 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)in_R9,0,(char *)0x0,(ulong)local_378._M_dataplus._M_p);
          }
          else {
LAB_002598d7:
            puVar25 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                (local_3a8 + 0x30,(ulong)local_350._M_dataplus._M_p);
          }
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          puVar31 = puVar25 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar31) {
            local_3e8.field_2._M_allocated_capacity = *puVar31;
            local_3e8.field_2._8_8_ = puVar25[3];
          }
          else {
            local_3e8.field_2._M_allocated_capacity = *puVar31;
            local_3e8._M_dataplus._M_p = (pointer)*puVar25;
          }
          local_3e8._M_string_length = puVar25[1];
          *puVar25 = puVar31;
          puVar25[1] = 0;
          *(undefined1 *)puVar31 = 0;
          puVar25 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3e8);
          psVar30 = puVar25 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410.field_2._8_8_ = puVar25[3];
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410._M_dataplus._M_p = (pointer)*puVar25;
          }
          local_410._M_string_length = puVar25[1];
          *puVar25 = psVar30;
          puVar25[1] = 0;
          *(undefined1 *)(puVar25 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_410,(ulong)(pRVar43->name)._M_dataplus._M_p);
          local_3b8._0_8_ = local_3a8;
          pSVar17 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar17) {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar17;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p != &local_350.field_2) {
            operator_delete(local_350._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          psVar8 = &local_328;
          _Var38._M_p = local_328._M_dataplus._M_p;
        }
        else {
          (*(local_3c8->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_3e8,local_3c8,pSVar40,(ulong)local_3bc.id);
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
          psVar30 = (size_type *)(plVar23 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410.field_2._8_8_ = plVar23[3];
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410._M_dataplus._M_p = (pointer)*plVar23;
          }
          local_410._M_string_length = plVar23[1];
          *plVar23 = (long)psVar30;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_410,(ulong)(pRVar43->name)._M_dataplus._M_p);
          local_3b8._0_8_ = local_3a8;
          pSVar17 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar17) {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar17;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          psVar8 = &local_3e8;
          _Var38._M_p = local_3e8._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var38._M_p != &psVar8->field_2) {
          operator_delete(_Var38._M_p);
        }
        uVar39 = pRVar43->index;
        cVar14 = '\x01';
        if (9 < uVar39) {
          uVar33 = uVar39;
          cVar12 = '\x04';
          do {
            cVar14 = cVar12;
            if (uVar33 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_00259e99;
            }
            if (uVar33 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_00259e99;
            }
            if (uVar33 < 10000) goto LAB_00259e99;
            bVar13 = 99999 < uVar33;
            uVar33 = uVar33 / 10000;
            cVar12 = cVar14 + '\x04';
          } while (bVar13);
          cVar14 = cVar14 + '\x01';
        }
LAB_00259e99:
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar14);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar39);
        plVar23 = (long *)::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3a35df);
        psVar30 = (size_type *)(plVar23 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar23 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar30) {
          local_410.field_2._M_allocated_capacity = *psVar30;
          local_410.field_2._8_8_ = plVar23[3];
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        }
        else {
          local_410.field_2._M_allocated_capacity = *psVar30;
          local_410._M_dataplus._M_p = (pointer)*plVar23;
        }
        local_410._M_string_length = plVar23[1];
        *plVar23 = (long)psVar30;
        plVar23[1] = 0;
        *(undefined1 *)(plVar23 + 2) = 0;
        plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
        local_3b8._0_8_ = local_3a8;
        pSVar17 = (SPIRVariable *)(plVar23 + 2);
        if ((SPIRVariable *)*plVar23 == pSVar17) {
          local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
          local_3a8._8_8_ = plVar23[3];
        }
        else {
          local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
          local_3b8._0_8_ = (SPIRVariable *)*plVar23;
        }
        local_3b8._8_8_ = plVar23[1];
        *plVar23 = (long)pSVar17;
        plVar23[1] = 0;
        *(undefined1 *)(plVar23 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
        if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
          operator_delete((void *)local_3b8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        sVar18 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)local_358,&local_3bc.id);
        if (sVar18 != 0) {
          ::std::__cxx11::string::append((char *)local_3f0);
        }
        ::std::__cxx11::string::append((char *)local_3f0);
        break;
      case Sampler:
        if (local_3f0->_M_string_length != 0) {
          ::std::__cxx11::string::append((char *)local_3f0);
        }
        sampler_type_abi_cxx11_(&local_3e8,local_3c8,pSVar40,local_3bc.id,false);
        plVar23 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
        psVar30 = (size_type *)(plVar23 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar23 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar30) {
          local_410.field_2._M_allocated_capacity = *psVar30;
          local_410.field_2._8_8_ = plVar23[3];
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        }
        else {
          local_410.field_2._M_allocated_capacity = *psVar30;
          local_410._M_dataplus._M_p = (pointer)*plVar23;
        }
        local_410._M_string_length = plVar23[1];
        *plVar23 = (long)psVar30;
        plVar23[1] = 0;
        *(undefined1 *)(plVar23 + 2) = 0;
        plVar23 = (long *)::std::__cxx11::string::_M_append
                                    ((char *)&local_410,(ulong)(pRVar43->name)._M_dataplus._M_p);
        local_3b8._0_8_ = local_3a8;
        pSVar22 = (SPIRVariable *)(plVar23 + 2);
        if ((SPIRVariable *)*plVar23 == pSVar22) {
          local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
          local_3a8._8_8_ = plVar23[3];
        }
        else {
          local_3a8._0_8_ = (pSVar22->super_IVariant)._vptr_IVariant;
          local_3b8._0_8_ = (SPIRVariable *)*plVar23;
        }
        local_3b8._8_8_ = plVar23[1];
        *plVar23 = (long)pSVar22;
        plVar23[1] = 0;
        *(undefined1 *)(plVar23 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
        if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
          operator_delete((void *)local_3b8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        bVar13 = is_var_runtime_size_array(local_3c8,pSVar17);
        if (bVar13) {
          uVar39 = pRVar43->index;
          cVar14 = '\x01';
          if (9 < uVar39) {
            uVar33 = uVar39;
            cVar12 = '\x04';
            do {
              cVar14 = cVar12;
              if (uVar33 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_0025a1b5;
              }
              if (uVar33 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_0025a1b5;
              }
              if (uVar33 < 10000) goto LAB_0025a1b5;
              bVar13 = 99999 < uVar33;
              uVar33 = uVar33 / 10000;
              cVar12 = cVar14 + '\x04';
            } while (bVar13);
            cVar14 = cVar14 + '\x01';
          }
LAB_0025a1b5:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar14);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar39);
          puVar25 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3a35de);
          psVar30 = puVar25 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410.field_2._8_8_ = puVar25[3];
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410._M_dataplus._M_p = (pointer)*puVar25;
          }
          local_410._M_string_length = puVar25[1];
          *puVar25 = psVar30;
          puVar25[1] = 0;
          *(undefined1 *)(puVar25 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3b8._0_8_ = local_3a8;
          pSVar17 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar17) {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar17;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
        }
        else {
          uVar39 = pRVar43->index;
          cVar14 = '\x01';
          if (9 < uVar39) {
            uVar33 = uVar39;
            cVar12 = '\x04';
            do {
              cVar14 = cVar12;
              if (uVar33 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_0025a2b7;
              }
              if (uVar33 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_0025a2b7;
              }
              if (uVar33 < 10000) goto LAB_0025a2b7;
              bVar13 = 99999 < uVar33;
              uVar33 = uVar33 / 10000;
              cVar12 = cVar14 + '\x04';
            } while (bVar13);
            cVar14 = cVar14 + '\x01';
          }
LAB_0025a2b7:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar14);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar39);
          puVar25 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3a35ea);
          psVar30 = puVar25 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410.field_2._8_8_ = puVar25[3];
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410._M_dataplus._M_p = (pointer)*puVar25;
          }
          local_410._M_string_length = puVar25[1];
          *puVar25 = psVar30;
          puVar25[1] = 0;
          *(undefined1 *)(puVar25 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3b8._0_8_ = local_3a8;
          pSVar17 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar17) {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar17;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
        }
        goto LAB_0025a5b6;
      case AccelerationStructure:
        bVar13 = is_var_runtime_size_array(local_3c8,pSVar17);
        if (bVar13) {
          add_spv_func_and_recompile(local_3c8,SPVFuncImplVariableDescriptor);
          pSVar40 = Variant::get<spirv_cross::SPIRType>
                              ((local_3c8->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               (pSVar40->parent_type).id);
          if (local_3f0->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)local_3f0);
          }
          (*(local_3c8->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_350,local_3c8,pSVar40,0);
          puVar25 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,0x3a35c2);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          psVar30 = puVar25 + 2;
          paVar41 = &local_410.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_328.field_2._M_allocated_capacity = *psVar30;
            local_328.field_2._8_8_ = puVar25[3];
          }
          else {
            local_328.field_2._M_allocated_capacity = *psVar30;
            local_328._M_dataplus._M_p = (pointer)*puVar25;
          }
          local_328._M_string_length = puVar25[1];
          *puVar25 = psVar30;
          puVar25[1] = 0;
          *(undefined1 *)(puVar25 + 2) = 0;
          puVar25 = (undefined8 *)::std::__cxx11::string::append((char *)&local_328);
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          puVar31 = puVar25 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar31) {
            local_378.field_2._M_allocated_capacity = *puVar31;
            local_378.field_2._8_8_ = puVar25[3];
          }
          else {
            local_378.field_2._M_allocated_capacity = *puVar31;
            local_378._M_dataplus._M_p = (pointer)*puVar25;
          }
          local_378._M_string_length = puVar25[1];
          *puVar25 = puVar31;
          puVar25[1] = 0;
          *(undefined1 *)(puVar25 + 2) = 0;
          to_restrict(local_3c8,local_3bc.id,true);
          plVar23 = (long *)::std::__cxx11::string::append(local_3a8 + 0x30);
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          puVar31 = (ulong *)(plVar23 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar31) {
            local_3e8.field_2._M_allocated_capacity = *puVar31;
            local_3e8.field_2._8_8_ = plVar23[3];
          }
          else {
            local_3e8.field_2._M_allocated_capacity = *puVar31;
            local_3e8._M_dataplus._M_p = (pointer)*plVar23;
          }
          local_3e8._M_string_length = plVar23[1];
          *plVar23 = (long)puVar31;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_3e8,(ulong)(pRVar43->name)._M_dataplus._M_p);
          psVar30 = (size_type *)(plVar23 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410.field_2._8_8_ = plVar23[3];
            local_410._M_dataplus._M_p = (pointer)paVar41;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410._M_dataplus._M_p = (pointer)*plVar23;
          }
          local_410._M_string_length = plVar23[1];
          *plVar23 = (long)psVar30;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3b8._0_8_ = local_3a8;
          pSVar17 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar17) {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar17;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != paVar41) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p != &local_350.field_2) {
            operator_delete(local_350._M_dataplus._M_p);
          }
          uVar39 = pRVar43->index;
          cVar14 = '\x01';
          if (9 < uVar39) {
            uVar33 = uVar39;
            cVar12 = '\x04';
            do {
              cVar14 = cVar12;
              if (uVar33 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_0025a4bb;
              }
              if (uVar33 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_0025a4bb;
              }
              if (uVar33 < 10000) goto LAB_0025a4bb;
              bVar13 = 99999 < uVar33;
              uVar33 = uVar33 / 10000;
              cVar12 = cVar14 + '\x04';
            } while (bVar13);
            cVar14 = cVar14 + '\x01';
          }
LAB_0025a4bb:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar14);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar39);
          puVar25 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3a35df);
          psVar30 = puVar25 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410.field_2._8_8_ = puVar25[3];
            local_410._M_dataplus._M_p = (pointer)paVar41;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410._M_dataplus._M_p = (pointer)*puVar25;
          }
          local_410._M_string_length = puVar25[1];
          *puVar25 = psVar30;
          puVar25[1] = 0;
          *(undefined1 *)(puVar25 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3b8._0_8_ = local_3a8;
          pSVar17 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar17) {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar17;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
        }
        else {
          if (local_3f0->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)local_3f0);
          }
          (*(local_3c8->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_3e8,local_3c8,pSVar40,(ulong)local_3bc.id);
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
          paVar41 = &local_410.field_2;
          psVar30 = (size_type *)(plVar23 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar23 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410.field_2._8_8_ = plVar23[3];
            local_410._M_dataplus._M_p = (pointer)paVar41;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410._M_dataplus._M_p = (pointer)*plVar23;
          }
          local_410._M_string_length = plVar23[1];
          *plVar23 = (long)psVar30;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_410,(ulong)(pRVar43->name)._M_dataplus._M_p);
          local_3b8._0_8_ = local_3a8;
          pSVar17 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar17) {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar17;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
          if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != paVar41) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          uVar39 = pRVar43->index;
          cVar14 = '\x01';
          if (9 < uVar39) {
            uVar33 = uVar39;
            cVar12 = '\x04';
            do {
              cVar14 = cVar12;
              if (uVar33 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_0025a3b9;
              }
              if (uVar33 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_0025a3b9;
              }
              if (uVar33 < 10000) goto LAB_0025a3b9;
              bVar13 = 99999 < uVar33;
              uVar33 = uVar33 / 10000;
              cVar12 = cVar14 + '\x04';
            } while (bVar13);
            cVar14 = cVar14 + '\x01';
          }
LAB_0025a3b9:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar14);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar39);
          puVar25 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3a35df);
          psVar30 = puVar25 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar30) {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410.field_2._8_8_ = puVar25[3];
            local_410._M_dataplus._M_p = (pointer)paVar41;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar30;
            local_410._M_dataplus._M_p = (pointer)*puVar25;
          }
          local_410._M_string_length = puVar25[1];
          *puVar25 = psVar30;
          puVar25[1] = 0;
          *(undefined1 *)(puVar25 + 2) = 0;
          plVar23 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3b8._0_8_ = local_3a8;
          pSVar17 = (SPIRVariable *)(plVar23 + 2);
          if ((SPIRVariable *)*plVar23 == pSVar17) {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3a8._8_8_ = plVar23[3];
          }
          else {
            local_3a8._0_8_ = (pSVar17->super_IVariant)._vptr_IVariant;
            local_3b8._0_8_ = (SPIRVariable *)*plVar23;
          }
          local_3b8._8_8_ = plVar23[1];
          *plVar23 = (long)pSVar17;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3b8._0_8_);
        }
LAB_0025a5b6:
        if ((SPIRVariable *)local_3b8._0_8_ != (SPIRVariable *)local_3a8) {
          operator_delete((void *)local_3b8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
      }
      pRVar43 = pRVar43 + 1;
    } while ((SPIRVariable *)pRVar43 != local_330);
  }
  SmallVector<Resource,_8UL>::~SmallVector((SmallVector<Resource,_8UL> *)local_248);
  return;
}

Assistant:

void CompilerMSL::entry_point_args_discrete_descriptors(string &ep_args)
{
	// Output resources, sorted by resource index & type
	// We need to sort to work around a bug on macOS 10.13 with NVidia drivers where switching between shaders
	// with different order of buffers can result in issues with buffer assignments inside the driver.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *discrete_descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
		uint32_t secondary_index;
	};

	SmallVector<Resource> resources;

	entry_point_bindings.clear();
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassPushConstant || var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			auto &type = get_variable_data_type(var);
			uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);

			if (is_supported_argument_buffer_type(type) && var.storage != StorageClassPushConstant)
			{
				if (descriptor_set_is_argument_buffer(desc_set))
				{
					if (is_var_runtime_size_array(var))
					{
						// Runtime arrays need to be wrapped in spvDescriptorArray from argument buffer payload.
						entry_point_bindings.push_back(&var);
						// We'll wrap this, so to_name() will always use non-qualified name.
						// We'll need the qualified name to create temporary variable instead.
						ir.meta[var_id].decoration.qualified_alias_explicit_override = true;
					}
					return;
				}
			}

			// Handle descriptor aliasing of simple discrete cases.
			// We can handle aliasing of buffers by casting pointers.
			// The amount of aliasing we can perform for discrete descriptors is very limited.
			// For fully mutable-style aliasing, we need argument buffers where we can exploit the fact
			// that descriptors are all 8 bytes.
			SPIRVariable *discrete_descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources)
				{
					if (get_decoration(resource.var->self, DecorationDescriptorSet) ==
					    get_decoration(var_id, DecorationDescriptorSet) &&
					    get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						discrete_descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.discrete_descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Emulate texture2D atomic operations
			uint32_t secondary_index = 0;
			if (atomic_image_vars_emulated.count(var.self))
			{
				secondary_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
			}

			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				entry_point_bindings.push_back(&var);
				for (uint32_t i = 0; i < plane_count; i++)
					resources.push_back({&var, discrete_descriptor_alias, to_name(var_id), SPIRType::Image,
					                     get_metal_resource_index(var, SPIRType::Image, i), i, secondary_index });

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					resources.push_back({&var, discrete_descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler,
					                     get_metal_resource_index(var, SPIRType::Sampler), 0, 0 });
				}
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				add_resource_name(var_id);

				// Don't allocate resource indices for aliases.
				uint32_t resource_index = ~0u;
				if (!discrete_descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				entry_point_bindings.push_back(&var);
				resources.push_back({&var, discrete_descriptor_alias, to_name(var_id), type.basetype,
				                     resource_index, 0, secondary_index });
			}
		}
	});

	stable_sort(resources.begin(), resources.end(),
	            [](const Resource &lhs, const Resource &rhs)
	            { return tie(lhs.basetype, lhs.index) < tie(rhs.basetype, rhs.index); });

	for (auto &r : resources)
	{
		auto &var = *r.var;
		auto &type = get_variable_data_type(var);

		uint32_t var_id = var.self;

		switch (r.basetype)
		{
		case SPIRType::Struct:
		{
			auto &m = ir.meta[type.self];
			if (m.members.size() == 0)
				break;

			if (r.discrete_descriptor_alias)
			{
				if (r.var == r.discrete_descriptor_alias)
				{
					auto primary_name = join("spvBufferAliasSet",
					                         get_decoration(var_id, DecorationDescriptorSet),
					                         "Binding",
					                         get_decoration(var_id, DecorationBinding));

					// Declare the primary alias as void*
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " void* " + primary_name;
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}

				buffer_aliases_discrete.push_back(r.var->self);
			}
			else if (!type.array.empty())
			{
				if (type.array.size() > 1)
					SPIRV_CROSS_THROW("Arrays of arrays of buffers are not supported.");

				is_using_builtin_array = true;
				if (is_var_runtime_size_array(var))
				{
					add_spv_func_and_recompile(SPVFuncImplVariableDescriptorArray);
					if (!ep_args.empty())
						ep_args += ", ";
					const bool ssbo = has_decoration(type.self, DecorationBufferBlock);
					if ((var.storage == spv::StorageClassStorageBuffer || ssbo) &&
					    msl_options.runtime_array_rich_descriptor)
					{
						add_spv_func_and_recompile(SPVFuncImplVariableSizedDescriptor);
						ep_args += "const device spvBufferDescriptor<" + get_argument_address_space(var) + " " +
						           type_to_glsl(type) + "*>* ";
					}
					else
					{
						add_spv_func_and_recompile(SPVFuncImplVariableDescriptor);
						ep_args += "const device spvDescriptor<" + get_argument_address_space(var) + " " +
						           type_to_glsl(type) + "*>* ";
					}
					ep_args += to_restrict(var_id, true) + r.name + "_";
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}
				else
				{
					uint32_t array_size = get_resource_array_size(type, var_id);
					for (uint32_t i = 0; i < array_size; ++i)
					{
						if (!ep_args.empty())
							ep_args += ", ";
						ep_args += get_argument_address_space(var) + " " + type_to_glsl(type) + "* " +
						           to_restrict(var_id, true) + r.name + "_" + convert_to_string(i);
						ep_args += " [[buffer(" + convert_to_string(r.index + i) + ")";
						if (interlocked_resources.count(var_id))
							ep_args += ", raster_order_group(0)";
						ep_args += "]]";
					}
				}
				is_using_builtin_array = false;
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += get_argument_address_space(var) + " ";

				if (recursive_inputs.count(type.self))
					ep_args += string("void* ") + to_restrict(var_id, true) + r.name + "_vp";
				else
					ep_args += type_to_glsl(type) + "& " + to_restrict(var_id, true) + r.name;

				ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::Sampler:
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += sampler_type(type, var_id, false) + " " + r.name;
			if (is_var_runtime_size_array(var))
				ep_args += "_ [[buffer(" + convert_to_string(r.index) + ")]]";
			else
				ep_args += " [[sampler(" + convert_to_string(r.index) + ")]]";
			break;
		case SPIRType::Image:
		{
			if (!ep_args.empty())
				ep_args += ", ";

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			const auto &basetype = get<SPIRType>(var.basetype);
			if (!type_is_msl_framebuffer_fetch(basetype))
			{
				ep_args += image_type_glsl(type, var_id, false) + " " + r.name;
				if (r.plane > 0)
					ep_args += join(plane_name_suffix, r.plane);

				if (is_var_runtime_size_array(var))
					ep_args += "_ [[buffer(" + convert_to_string(r.index) + ")";
				else
					ep_args += " [[texture(" + convert_to_string(r.index) + ")";

				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			else
			{
				if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("Framebuffer fetch on Mac is not supported before MSL 2.3.");
				ep_args += image_type_glsl(type, var_id, false) + " " + r.name;
				ep_args += " [[color(" + convert_to_string(r.index) + ")]]";
			}

			// Emulate texture2D atomic operations
			if (atomic_image_vars_emulated.count(var.self))
			{
				auto &flags = ir.get_decoration_bitset(var.self);
				const char *cv_flags = decoration_flags_signal_volatile(flags) ? "volatile " : "";
				ep_args += join(", ", cv_flags, "device atomic_", type_to_glsl(get<SPIRType>(basetype.image.type), 0));
				ep_args += "* " + r.name + "_atomic";
				ep_args += " [[buffer(" + convert_to_string(r.secondary_index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::AccelerationStructure:
		{
			if (is_var_runtime_size_array(var))
			{
				add_spv_func_and_recompile(SPVFuncImplVariableDescriptor);
				const auto &parent_type = get<SPIRType>(type.parent_type);
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += "const device spvDescriptor<" + type_to_glsl(parent_type) + ">* " +
				           to_restrict(var_id, true) + r.name + "_";
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			}
			break;
		}
		default:
			if (!ep_args.empty())
				ep_args += ", ";
			if (!type.pointer)
				ep_args += get_type_address_space(get<SPIRType>(var.basetype), var_id) + " " +
				           type_to_glsl(type, var_id) + "& " + r.name;
			else
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
			if (interlocked_resources.count(var_id))
				ep_args += ", raster_order_group(0)";
			ep_args += "]]";
			break;
		}
	}
}